

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCase::
verify<tcu::Texture2DView,tcu::Vector<float,2>>
          (TextureGatherCase *this,ConstPixelBufferAccess *rendered,Texture2DView *texture,
          Vector<float,_2> (*texCoords) [4],GatherArgs *gatherArgs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  TextureFormat TVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  float fVar6;
  float fVar7;
  GatherType gatherType;
  uint uVar8;
  ChannelOrder width;
  int iVar9;
  uint uVar10;
  int iVar11;
  Vector<float,_2> VVar12;
  PixelOffsets *pPVar13;
  bool bVar14;
  bool bVar15;
  int i;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ConstPixelBufferAccess *pCVar20;
  Surface *pSVar21;
  WrapMode WVar22;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar23;
  void *data;
  undefined8 data_00;
  int px;
  ChannelOrder y;
  int iVar24;
  ChannelOrder CVar25;
  TextureFormat TVar26;
  int px_1;
  int iVar27;
  Vector<float,_2> texCoord;
  Vector<bool,_4> res_12;
  Vector<bool,_4> res_11;
  Vector<bool,_4> res_4;
  Vec2 viewportCoord;
  Surface ideal;
  Surface errorMask_1;
  Surface errorMask;
  Vec4 resultPix;
  Vec4 idealPix;
  TextureLevel ideal_1;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  pixelOffsets;
  PixelBufferAccess idealAccess;
  Sampler sampler;
  Vector<int,_4> res;
  IVec4 colorBits;
  undefined1 local_438 [8];
  TextureFormat TStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  byte local_40c [4];
  TextureFormat local_408;
  float local_400;
  byte local_3fc [4];
  string local_3f8;
  float local_3d0;
  float local_3cc;
  ConstPixelBufferAccess *local_3c8;
  undefined1 local_3c0 [8];
  TextureFormat local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined1 local_398 [8];
  void *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  Surface local_378;
  undefined1 local_360 [8];
  void *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  Texture2DView *local_340;
  LogImage local_338;
  undefined1 local_2a0 [24];
  undefined2 local_288;
  undefined2 uStack_286;
  undefined1 local_284;
  TextureLevel local_278;
  Vector<float,_2> (*local_250) [4];
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_248;
  undefined1 local_238 [24];
  TextureFormat local_220;
  TextureFormat TStack_218;
  BVec4 local_210;
  Sampler local_208;
  undefined1 local_1c8 [8];
  TextureFormat TStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  ios_base local_150 [264];
  IVec4 local_48;
  
  local_250 = texCoords;
  local_408 = *(TextureFormat *)(*(long *)(this + 8) + 0x10);
  local_3c8 = rendered;
  local_340 = texture;
  if (((byte)this[0xb4] & 1) != 0) {
    uVar19 = 0;
    uVar17 = (ulong)(uint)gatherArgs->componentNdx;
    if (gatherArgs->componentNdx < 1) {
      uVar17 = uVar19;
    }
    local_338.m_name._M_dataplus._M_p = (pointer)0x0;
    local_338.m_name._M_string_length = 0x3f80000000000000;
    WVar22 = *(WrapMode *)((long)(&local_338.m_access.m_size + -6) + uVar17 * 4);
    do {
      (&local_208.wrapS)[uVar19] = WVar22;
      uVar19 = uVar19 + 1;
    } while (uVar19 != 4);
    bVar15 = anon_unknown_0::verifySingleColored((TestLog *)local_408,rendered,(Vec4 *)&local_208);
    if (bVar15) {
      return bVar15;
    }
    local_1c8 = (undefined1  [8])local_408;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_1c0,"Note: expected color ",0x15);
    tcu::operator<<((ostream *)&TStack_1c0,(Vector<float,_4> *)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_1c0," for all pixels; ",0x11);
    std::ostream::_M_insert<double>
              ((double)*(float *)((long)(&local_338.m_access.m_size + -6) + uVar17 * 4));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_1c0," is component at index ",0x17);
    std::ostream::operator<<(&TStack_1c0,(int)uVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_1c0," in the color ",0xe);
    tcu::operator<<((ostream *)&TStack_1c0,(Vector<float,_4> *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_1c0,", which is used for incomplete textures",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_1c0);
    std::ios_base::~ios_base(local_150);
    return bVar15;
  }
  gatherType = *(GatherType *)(this + 0x78);
  anon_unknown_0::TextureGatherCase::getOffsetRange((TextureGatherCase *)local_1c8);
  anon_unknown_0::makePixelOffsetsFunctor(&local_248,gatherType,gatherArgs,(IVec2 *)local_1c8);
  pPVar13 = local_248.
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
            .m_data.ptr;
  TVar26 = local_408;
  local_338.m_name._M_dataplus._M_p = (pointer)0x800000008;
  local_338.m_name._M_string_length = 0x800000008;
  local_1c8._0_4_ = R;
  local_1c8._4_4_ = SNORM_INT8;
  TStack_1c0.order = R;
  TStack_1c0.type = SNORM_INT8;
  lVar16 = 0;
  do {
    *(int *)(local_1c8 + lVar16 * 4) =
         *(int *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) + -1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  local_208.wrapS = CLAMP_TO_EDGE;
  local_208.wrapT = CLAMP_TO_EDGE;
  local_208.wrapR = CLAMP_TO_EDGE;
  local_208.minFilter = NEAREST;
  local_48.m_data[0] = 0;
  local_48.m_data[1] = 0;
  local_48.m_data[2] = 0;
  local_48.m_data[3] = 0;
  lVar16 = 0;
  do {
    WVar22 = (&local_208.wrapS)[lVar16];
    if ((int)(&local_208.wrapS)[lVar16] < (int)*(WrapMode *)(local_1c8 + lVar16 * 4)) {
      WVar22 = *(WrapMode *)(local_1c8 + lVar16 * 4);
    }
    local_48.m_data[lVar16] = WVar22;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  uVar8 = *(uint *)(this + 0xb8);
  uVar17 = (ulong)uVar8;
  iVar23 = -1;
  CVar25 = ~R;
  iVar27 = -1;
  if (uVar17 < 3) {
    CVar25 = *(ChannelOrder *)(&DAT_009c05a8 + uVar17 * 4);
    iVar27 = uVar8 * 10;
  }
  iVar24 = -1;
  if (uVar8 < 3) {
    iVar23 = *(int *)(&DAT_009c05b4 + uVar17 * 4);
    iVar24 = *(int *)(&DAT_009c05c0 + uVar17 * 4);
  }
  local_208.wrapR = WRAPMODE_LAST;
  local_208.minFilter = FILTERMODE_LAST;
  local_208.magFilter = FILTERMODE_LAST;
  local_208.lodThreshold = 0.0;
  local_208.normalizedCoords = true;
  local_208.depthStencilMode = MODE_DEPTH;
  local_208.borderColor.v.uData[0]._0_1_ = 0;
  local_208.borderColor.v._1_7_ = 0;
  local_208.borderColor.v.uData[2]._0_1_ = 0;
  local_208._45_8_ = 0;
  local_208._0_8_ = *(undefined8 *)(this + 0x8c);
  local_208.compareChannel = 0;
  local_208.compare = *(uint *)(this + 0x88);
  if ((*(int *)(this + 0x80) == 0x14) || (*(int *)(this + 0x80) == 0x12)) {
    lVar16 = 0;
    do {
      local_278.m_size.m_data[lVar16 + -2] = 0x16;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 3;
    do {
      local_278.m_size.m_data[lVar16 + -2] = 0x10;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    local_278.m_data.m_ptr = (void *)0x1000000010;
    local_278.m_data.m_cap._0_4_ = 7;
    local_378._0_8_ = &PTR_operator___00b57968;
    local_378.m_pixels.m_ptr = (void *)0x4000000040;
    width = (local_3c8->m_size).m_data[0];
    local_278.m_format.order = CVar25;
    local_278.m_format.type = CVar25;
    local_278.m_size.m_data[0] = iVar27;
    local_278.m_size.m_data[1] = iVar23;
    local_278.m_size.m_data[2] = iVar23;
    local_278._20_4_ = iVar24;
    tcu::Surface::Surface((Surface *)local_398,width,width);
    TVar26 = local_408;
    local_1c8._0_4_ = RGBA;
    local_1c8._4_4_ = UNORM_INT8;
    data = (void *)CONCAT26(local_388._M_allocated_capacity._6_2_,
                            local_388._M_allocated_capacity._0_6_);
    if ((void *)CONCAT26(local_388._M_allocated_capacity._6_2_,local_388._M_allocated_capacity._0_6_
                        ) != (void *)0x0) {
      data = local_390;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_238,(TextureFormat *)local_1c8,local_398._0_4_,
               local_398._4_4_,1,data);
    tcu::Surface::Surface((Surface *)local_360,width,width);
    local_338.m_name._M_dataplus._M_p = (pointer)0x300000008;
    data_00 = local_350._M_allocated_capacity;
    if ((void *)local_350._M_allocated_capacity != (void *)0x0) {
      data_00 = local_358;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_338,local_360._0_4_,
               local_360._4_4_,1,(void *)data_00);
    local_2a0._0_4_ = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)&local_338);
    tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)&local_338);
    if ((int)width < 1) {
      bVar15 = true;
    }
    else {
      local_3d0 = (float)(int)width;
      bVar15 = true;
      CVar25 = R;
      do {
        local_3cc = (float)(int)CVar25;
        y = R;
        do {
          local_1b8._M_allocated_capacity = 0;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1c8._0_4_ = R;
          local_1c8._4_4_ = SNORM_INT8;
          TStack_1c0.order = R;
          TStack_1c0.type = SNORM_INT8;
          local_338.m_name._M_dataplus._M_p._4_4_ = CVar25;
          local_338.m_name._M_dataplus._M_p._0_4_ = y;
          (**pPVar13->_vptr_PixelOffsets)(pPVar13,&local_338,(IVec2 (*) [4])local_1c8);
          local_2a0._4_4_ = local_3cc;
          local_2a0._0_4_ = (float)(int)y;
          local_338.m_name._M_dataplus._M_p = (pointer)0x0;
          lVar16 = 0;
          do {
            *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) =
                 *(float *)(local_2a0 + lVar16 * 4) + 0.5;
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          local_438._4_4_ = local_3d0;
          local_438._0_4_ = local_3d0;
          local_3c0._0_4_ = R;
          local_3c0._4_4_ = SNORM_INT8;
          lVar16 = 0;
          do {
            *(float *)(local_3c0 + lVar16 * 4) =
                 *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) /
                 *(float *)(local_438 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          VVar12 = triQuadInterpolate<tcu::Vector<float,2>>
                             ((_anonymous_namespace_ *)local_438,local_250,(float)local_3c0._0_4_,
                              (float)local_3c0._4_4_);
          local_400 = (float)(**(code **)local_378._0_8_)(VVar12.m_data[0],&local_378,&local_338);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&local_338,(int)local_3c8,y,CVar25);
          tcu::gatherArray2DOffsetsCompare
                    ((tcu *)local_2a0,local_340->m_levels,&local_208,local_400,
                     (float)local_438._0_4_,(float)local_438._4_4_,0,(IVec2 (*) [4])local_1c8);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_238,(Vec4 *)local_2a0,y,CVar25,0);
          local_3f8._M_dataplus._M_p = local_3f8._M_dataplus._M_p & 0xffffffff00000000;
          lVar16 = 0;
          do {
            *(bool *)((long)&local_3f8._M_dataplus._M_p + lVar16) =
                 *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) ==
                 *(float *)(local_2a0 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          if ((char)local_3f8._M_dataplus._M_p == '\0') {
LAB_005ff790:
            bVar14 = tcu::isGatherOffsetsCompareResultValid
                               (local_340,&local_208,(TexComparePrecision *)&local_278,
                                (Vec2 *)local_438,(IVec2 (*) [4])local_1c8,local_400,
                                (Vec4 *)&local_338);
            if (!bVar14) {
              *(undefined4 *)((long)local_358 + (long)(int)(local_360._0_4_ * CVar25 + y) * 4) =
                   0xff0000ff;
              bVar15 = false;
            }
          }
          else {
            uVar17 = 0xffffffffffffffff;
            do {
              if (uVar17 == 2) {
                uVar19 = 3;
                break;
              }
              uVar19 = uVar17 + 1;
              lVar16 = uVar17 + 2;
              uVar17 = uVar19;
            } while (*(char *)((long)&local_3f8._M_dataplus._M_p + lVar16) != '\0');
            if (uVar19 < 3) goto LAB_005ff790;
          }
          y = y + A;
        } while (y != width);
        CVar25 = CVar25 + A;
        TVar26 = local_408;
      } while (CVar25 != width);
    }
    TVar3 = (TextureFormat)((long)local_2a0 + 0x10);
    local_2a0._16_8_ = 0x6552796669726556;
    _local_288 = 0x746c7573;
    local_2a0._8_8_ = 0xc;
    local_284 = '\0';
    local_3c0 = (undefined1  [8])&local_3b0;
    local_1c8._0_4_ = S;
    local_1c8._4_4_ = SNORM_INT8;
    local_2a0._0_8_ = TVar3;
    local_3c0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_3c0,(ulong)local_1c8);
    local_3b0._M_allocated_capacity = (size_type)local_1c8;
    *(undefined8 *)local_3c0 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_3c0 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_3c0 + 0xf),"sult",4);
    local_3b8.order = local_1c8._0_4_;
    local_3b8.type = local_1c8._4_4_;
    *(char *)((long)local_3c0 + (long)local_1c8) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_338,(string *)local_2a0,(string *)local_3c0)
    ;
    tcu::TestLog::startImageSet
              ((TestLog *)TVar26,local_338.m_name._M_dataplus._M_p,
               local_338.m_description._M_dataplus._M_p);
    local_428._M_allocated_capacity._0_4_ = 0x646e6552;
    local_428._M_allocated_capacity._4_4_ = 0x64657265;
    TStack_430.order = RGBA;
    TStack_430.type = SNORM_INT8;
    local_428._8_2_ = (ushort)(byte)local_428._M_local_buf[9] << 8;
    paVar1 = &local_3f8.field_2;
    local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_3f8.field_2._M_local_buf[8] = ' ';
    local_3f8.field_2._M_local_buf[9] = 'i';
    local_3f8.field_2._10_4_ = 0x6567616d;
    local_3f8._M_string_length._0_4_ = sRGB;
    local_3f8._M_string_length._4_4_ = SNORM_INT8;
    local_3f8.field_2._M_local_buf[0xe] = '\0';
    pCVar20 = local_3c8;
    local_438 = (undefined1  [8])&local_428;
    local_3f8._M_dataplus._M_p = (pointer)paVar1;
    tcu::LogImage::LogImage
              ((LogImage *)local_1c8,(string *)local_438,&local_3f8,local_3c8,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1c8,TVar26.order,__buf,(size_t)pCVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      (ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                               local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    paVar4 = &local_338.m_description.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_description._M_dataplus._M_p != paVar4) {
      operator_delete(local_338.m_description._M_dataplus._M_p,
                      local_338.m_description.field_2._M_allocated_capacity + 1);
    }
    paVar5 = &local_338.m_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != paVar5) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3c0 != (undefined1  [8])&local_3b0) {
      operator_delete((void *)local_3c0,(ulong)(local_3b0._M_allocated_capacity + 1));
    }
    if ((TextureFormat)local_2a0._0_8_ != TVar3) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if (!bVar15) {
      local_2a0._16_8_ = 0x636e657265666552;
      local_288 = 0x65;
      local_2a0._8_8_ = 9;
      local_3c0 = (undefined1  [8])&local_3b0;
      local_338.m_name._M_dataplus._M_p = (pointer)0x15;
      local_2a0._0_8_ = TVar3;
      local_3c0 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_3c0,(ulong)&local_338);
      local_3b0._M_allocated_capacity = (size_type)local_338.m_name._M_dataplus._M_p;
      *(undefined8 *)local_3c0 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_3c0 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_3c0 + 0xd),"ce image",8);
      local_3b8 = (TextureFormat)local_338.m_name._M_dataplus._M_p;
      *(char *)((long)local_3c0 + (long)local_338.m_name._M_dataplus._M_p) = '\0';
      pSVar21 = (Surface *)local_398;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,(string *)local_2a0,(string *)local_3c0,pSVar21,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_00,(size_t)pSVar21);
      local_428._M_allocated_capacity._0_4_ = 0x6f727245;
      local_428._M_allocated_capacity._4_4_ = 0x73614d72;
      local_428._8_2_ = 0x6b;
      TStack_430.order = ARGB;
      TStack_430.type = SNORM_INT8;
      local_3f8.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_3f8.field_2._M_allocated_capacity._6_2_ = 0x616d;
      local_3f8.field_2._M_local_buf[8] = 's';
      local_3f8.field_2._M_local_buf[9] = 'k';
      local_3f8._M_string_length._0_4_ = BGR;
      local_3f8._M_string_length._4_4_ = SNORM_INT8;
      local_3f8.field_2._10_4_ = local_3f8.field_2._10_4_ & 0xffffff00;
      pSVar21 = (Surface *)local_360;
      local_438 = (undefined1  [8])&local_428;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      tcu::LogImage::LogImage
                (&local_338,(string *)local_438,&local_3f8,pSVar21,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_338,local_408.order,__buf_01,(size_t)pSVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_description._M_dataplus._M_p != paVar4) {
        operator_delete(local_338.m_description._M_dataplus._M_p,
                        local_338.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != paVar5) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,(ulong)(local_3b0._M_allocated_capacity + 1));
      }
      if ((TextureFormat)local_2a0._0_8_ != TVar3) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_408);
    tcu::Surface::~Surface((Surface *)local_360);
    tcu::Surface::~Surface((Surface *)local_398);
    goto LAB_00601011;
  }
  local_400 = 0.0;
  if (0 < gatherArgs->componentNdx) {
    local_400 = (float)gatherArgs->componentNdx;
  }
  uVar8 = *(uint *)(this + 0x84);
  uVar17 = (ulong)uVar8;
  if (uVar17 < 0x22) {
    if ((0x58UL >> (uVar17 & 0x3f) & 1) == 0) {
      if ((0x2c0000000U >> (uVar17 & 0x3f) & 1) == 0) goto LAB_00600b59;
      goto LAB_005ff991;
    }
    lVar16 = 0;
    do {
      *(undefined4 *)(local_238 + lVar16 * 4) = 0x16;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 3;
    do {
      *(undefined4 *)(local_238 + lVar16 * 4) = 0x10;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    local_220.order = R;
    local_220.type = SNORM_INT8;
    TStack_218 = (TextureFormat)0x0;
    local_210.m_data[0] = true;
    local_210.m_data[1] = true;
    local_210.m_data[2] = true;
    local_210.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)local_1c8,&local_48);
    pPVar13 = local_248.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
              .m_data.ptr;
    local_220.order = local_1c8._0_4_;
    local_220.type = local_1c8._4_4_;
    TStack_218 = TStack_1c0;
    local_210.m_data[0] = true;
    local_210.m_data[1] = true;
    local_210.m_data[2] = true;
    local_210.m_data[3] = true;
    iVar9 = (local_3c8->m_size).m_data[0];
    local_238._0_4_ = CVar25;
    local_238._4_4_ = CVar25;
    local_238._8_4_ = iVar27;
    local_238._12_4_ = iVar23;
    local_238._16_4_ = iVar23;
    local_238._20_4_ = iVar24;
    tcu::TextureLevel::TextureLevel(&local_278,&local_3c8->m_format,iVar9,iVar9,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a0,&local_278);
    tcu::Surface::Surface(&local_378,iVar9,iVar9);
    local_338.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
      local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_338,local_378.m_width,
               local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
    local_3c0._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_338);
    tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)&local_338);
    if (iVar9 < 1) {
      bVar15 = true;
    }
    else {
      local_3d0 = (float)iVar9;
      bVar15 = true;
      iVar23 = 0;
      do {
        local_3cc = (float)iVar23;
        iVar27 = 0;
        do {
          local_1b8._M_allocated_capacity = 0;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1c8._0_4_ = R;
          local_1c8._4_4_ = SNORM_INT8;
          TStack_1c0.order = R;
          TStack_1c0.type = SNORM_INT8;
          local_338.m_name._M_dataplus._M_p._4_4_ = iVar23;
          local_338.m_name._M_dataplus._M_p._0_4_ = iVar27;
          (**pPVar13->_vptr_PixelOffsets)(pPVar13,&local_338,(IVec2 (*) [4])local_1c8);
          local_3c0._4_4_ = local_3cc;
          local_3c0._0_4_ = (float)iVar27;
          local_338.m_name._M_dataplus._M_p = (pointer)0x0;
          lVar16 = 0;
          do {
            *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) =
                 *(float *)(local_3c0 + lVar16 * 4) + 0.5;
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          local_438._4_4_ = local_3d0;
          local_438._0_4_ = local_3d0;
          local_398 = (undefined1  [8])0x0;
          lVar16 = 0;
          do {
            *(float *)(local_398 + lVar16 * 4) =
                 *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) /
                 *(float *)(local_438 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          triQuadInterpolate<tcu::Vector<float,2>>
                    ((_anonymous_namespace_ *)local_360,local_250,(float)local_398._0_4_,
                     (float)local_398._4_4_);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)&local_338,(int)local_3c8,iVar27,iVar23);
          tcu::gatherArray2DOffsets
                    ((tcu *)local_3c0,local_340->m_levels,&local_208,(float)local_360._0_4_,
                     (float)local_360._4_4_,0,(int)local_400,(IVec2 (*) [4])local_1c8);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_2a0,(Vec4 *)local_3c0,iVar27,iVar23,0);
          local_438._0_4_ = 0.0;
          local_438._4_4_ = 0.0;
          TStack_430.order = R;
          TStack_430.type = SNORM_INT8;
          lVar16 = 0;
          do {
            fVar6 = *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4);
            fVar7 = *(float *)(local_3c0 + lVar16 * 4);
            *(uint *)(local_438 + lVar16 * 4) =
                 ~-(uint)(fVar7 < fVar6) & (uint)(fVar7 - fVar6) |
                 (uint)(fVar6 - fVar7) & -(uint)(fVar7 < fVar6);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_3f8._M_dataplus._M_p = (pointer)local_220;
          local_3f8._M_string_length._0_4_ = TStack_218.order;
          local_3f8._M_string_length._4_4_ = TStack_218.type;
          local_3fc[0] = 0;
          local_3fc[1] = 0;
          local_3fc[2] = 0;
          local_3fc[3] = 0;
          lVar16 = 0;
          do {
            pfVar2 = (float *)((long)&local_3f8._M_dataplus._M_p + lVar16 * 4);
            local_3fc[lVar16] =
                 *pfVar2 <= *(float *)(local_438 + lVar16 * 4) &&
                 *(float *)(local_438 + lVar16 * 4) != *pfVar2;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_40c[0] = 0;
          local_40c[1] = 0;
          local_40c[2] = 0;
          local_40c[3] = 0;
          lVar16 = 0;
          do {
            local_40c[lVar16] = local_3fc[lVar16] & local_210.m_data[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          if (local_40c[0] == 0) {
            uVar17 = 0xffffffffffffffff;
            do {
              if (uVar17 == 2) {
                uVar19 = 3;
                break;
              }
              uVar19 = uVar17 + 1;
              lVar16 = uVar17 + 2;
              uVar17 = uVar19;
            } while (local_40c[lVar16] != 1);
            if (uVar19 < 3) goto LAB_0060064c;
          }
          else {
LAB_0060064c:
            bVar14 = tcu::isGatherOffsetsResultValid
                               (local_340,&local_208,(LookupPrecision *)local_238,(Vec2 *)local_360,
                                (int)local_400,(IVec2 (*) [4])local_1c8,(Vec4 *)&local_338);
            if (!bVar14) {
              *(undefined4 *)
               ((long)local_378.m_pixels.m_ptr + (long)(local_378.m_width * iVar23 + iVar27) * 4) =
                   0xff0000ff;
              bVar15 = false;
            }
          }
          iVar27 = iVar27 + 1;
        } while (iVar27 != iVar9);
        iVar23 = iVar23 + 1;
      } while (iVar23 != iVar9);
    }
    local_3b0._M_allocated_capacity._0_4_ = 0x69726556;
    local_3b0._M_allocated_capacity._4_4_ = 0x65527966;
    local_3b0._8_4_ = 0x746c7573;
    local_3b8.order = sR;
    local_3b8.type = SNORM_INT8;
    local_3b0._M_local_buf[0xc] = '\0';
    local_438 = (undefined1  [8])&local_428;
    local_1c8._0_4_ = S;
    local_1c8._4_4_ = SNORM_INT8;
    local_3c0 = (undefined1  [8])&local_3b0;
    local_438 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
    TVar26 = local_408;
    local_428._M_allocated_capacity = (size_type)local_1c8;
    *(undefined8 *)local_438 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
    TStack_430.order = local_1c8._0_4_;
    TStack_430.type = local_1c8._4_4_;
    *(char *)((long)local_438 + (long)local_1c8) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_338,(string *)local_3c0,(string *)local_438)
    ;
    tcu::TestLog::startImageSet
              ((TestLog *)TVar26,local_338.m_name._M_dataplus._M_p,
               local_338.m_description._M_dataplus._M_p);
    paVar1 = &local_3f8.field_2;
    local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_3f8._M_string_length._0_4_ = RGBA;
    local_3f8._M_string_length._4_4_ = SNORM_INT8;
    local_3f8.field_2._M_local_buf[8] = '\0';
    local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_388._M_allocated_capacity._6_2_ = 0x6465;
    local_388._8_2_ = 0x6920;
    local_388._10_4_ = 0x6567616d;
    local_390 = (void *)0xe;
    local_388._M_local_buf[0xe] = '\0';
    pCVar20 = local_3c8;
    local_3f8._M_dataplus._M_p = (pointer)paVar1;
    local_398 = (undefined1  [8])&local_388;
    tcu::LogImage::LogImage
              ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3c8,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1c8,TVar26.order,__buf_02,(size_t)pCVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      (ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    if (local_398 != (undefined1  [8])&local_388) {
      operator_delete((void *)local_398,
                      CONCAT26(local_388._M_allocated_capacity._6_2_,
                               local_388._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                               local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
    }
    paVar4 = &local_338.m_description.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_description._M_dataplus._M_p != paVar4) {
      operator_delete(local_338.m_description._M_dataplus._M_p,
                      local_338.m_description.field_2._M_allocated_capacity + 1);
    }
    paVar5 = &local_338.m_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != paVar5) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if (local_3c0 != (undefined1  [8])&local_3b0) {
      operator_delete((void *)local_3c0,(ulong)(local_3b0._M_allocated_capacity + 1));
    }
    if (bVar15 == false) {
      local_438 = (undefined1  [8])&local_428;
      local_428._M_allocated_capacity._0_4_ = 0x65666552;
      local_428._M_allocated_capacity._4_4_ = 0x636e6572;
      local_428._8_2_ = 0x65;
      TStack_430.order = ARGB;
      TStack_430.type = SNORM_INT8;
      local_338.m_name._M_dataplus._M_p = (pointer)0x15;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      local_3f8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_338);
      local_3f8.field_2._M_allocated_capacity._0_6_ = SUB86(local_338.m_name._M_dataplus._M_p,0);
      local_3f8.field_2._M_allocated_capacity._6_2_ =
           (undefined2)((ulong)local_338.m_name._M_dataplus._M_p >> 0x30);
      *(undefined8 *)local_3f8._M_dataplus._M_p = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 0xd),"ce image",8);
      local_3f8._M_string_length = (size_type)local_338.m_name._M_dataplus._M_p;
      *(char *)((long)local_3f8._M_dataplus._M_p + (long)local_338.m_name._M_dataplus._M_p) = '\0';
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_3c0,&local_278);
      pCVar20 = (ConstPixelBufferAccess *)local_3c0;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar20,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_03,(size_t)pCVar20);
      local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
      local_388._M_allocated_capacity._6_2_ = 0x7361;
      local_388._8_2_ = 0x6b;
      local_390 = (void *)0x9;
      local_350._M_allocated_capacity = 0x616d20726f727245;
      local_350._8_2_ = 0x6b73;
      local_358 = (void *)0xa;
      local_350._M_local_buf[10] = '\0';
      pSVar21 = &local_378;
      local_398 = (undefined1  [8])&local_388;
      local_360 = (undefined1  [8])&local_350;
      tcu::LogImage::LogImage
                (&local_338,(string *)local_398,(string *)local_360,pSVar21,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_338,local_408.order,__buf_04,(size_t)pSVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_description._M_dataplus._M_p != paVar4) {
        operator_delete(local_338.m_description._M_dataplus._M_p,
                        local_338.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != paVar5) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_360 != (undefined1  [8])&local_350) {
        operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
      }
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,
                        CONCAT26(local_388._M_allocated_capacity._6_2_,
                                 local_388._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_408);
  }
  else {
LAB_00600b59:
    if (2 < uVar8 - 0x1b) {
LAB_00601429:
      bVar15 = false;
      goto LAB_00601011;
    }
LAB_005ff991:
    lVar16 = 0;
    do {
      *(undefined4 *)(local_238 + lVar16 * 4) = 0x16;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 3;
    do {
      *(undefined4 *)(local_238 + lVar16 * 4) = 0x10;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    local_220.order = R;
    local_220.type = SNORM_INT8;
    TStack_218.order = R;
    TStack_218.type = SNORM_INT8;
    local_210.m_data[0] = true;
    local_210.m_data[1] = true;
    local_210.m_data[2] = true;
    local_210.m_data[3] = true;
    if ((uVar8 < 0x22) && ((0x2c0000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
      iVar9 = (local_3c8->m_size).m_data[0];
      local_238._0_4_ = CVar25;
      local_238._4_4_ = CVar25;
      local_238._8_4_ = iVar27;
      local_238._12_4_ = iVar23;
      local_238._16_4_ = iVar23;
      local_238._20_4_ = iVar24;
      tcu::TextureLevel::TextureLevel(&local_278,&local_3c8->m_format,iVar9,iVar9,1);
      TVar26 = local_408;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a0,&local_278);
      tcu::Surface::Surface(&local_378,iVar9,iVar9);
      local_338.m_name._M_dataplus._M_p = (pointer)0x300000008;
      if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
        local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_338,local_378.m_width,
                 local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
      local_3c0._0_4_ = 0xff00ff00;
      tcu::RGBA::toVec((RGBA *)&local_338);
      tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)&local_338);
      if (iVar9 < 1) {
        bVar15 = true;
      }
      else {
        local_3d0 = (float)iVar9;
        bVar15 = true;
        iVar23 = 0;
        do {
          local_3cc = (float)iVar23;
          iVar27 = 0;
          do {
            local_1b8._M_allocated_capacity = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = 0;
            local_1c8._0_4_ = R;
            local_1c8._4_4_ = SNORM_INT8;
            TStack_1c0.order = R;
            TStack_1c0.type = SNORM_INT8;
            local_338.m_name._M_dataplus._M_p._4_4_ = iVar23;
            local_338.m_name._M_dataplus._M_p._0_4_ = iVar27;
            (**pPVar13->_vptr_PixelOffsets)(pPVar13,&local_338,(IVec2 (*) [4])local_1c8);
            local_3c0._4_4_ = local_3cc;
            local_3c0._0_4_ = (float)iVar27;
            local_338.m_name._M_dataplus._M_p = (pointer)0x0;
            lVar16 = 0;
            do {
              *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) =
                   *(float *)(local_3c0 + lVar16 * 4) + 0.5;
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            local_438._4_4_ = local_3d0;
            local_438._0_4_ = local_3d0;
            local_398 = (undefined1  [8])0x0;
            lVar16 = 0;
            do {
              *(float *)(local_398 + lVar16 * 4) =
                   *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) /
                   *(float *)(local_438 + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            triQuadInterpolate<tcu::Vector<float,2>>
                      ((_anonymous_namespace_ *)local_360,local_250,(float)local_398._0_4_,
                       (float)local_398._4_4_);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_3c0,(int)local_3c8,iVar27,iVar23);
            tcu::gatherArray2DOffsets
                      ((tcu *)&local_338,local_340->m_levels,&local_208,(float)local_360._0_4_,
                       (float)local_360._4_4_,0,(int)local_400,(IVec2 (*) [4])local_1c8);
            local_438._0_4_ = 0.0;
            local_438._4_4_ = 0.0;
            TStack_430.order = R;
            TStack_430.type = SNORM_INT8;
            lVar16 = 0;
            do {
              *(int *)(local_438 + lVar16 * 4) =
                   (int)(long)*(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            local_338.m_name._M_dataplus._M_p = (pointer)local_438;
            local_338.m_name._M_string_length._0_4_ = TStack_430.order;
            local_338.m_name._M_string_length._4_4_ = TStack_430.type;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2a0,(IVec4 *)&local_338,iVar27,iVar23,0);
            local_338.m_name._M_dataplus._M_p = (pointer)0x0;
            local_338.m_name._M_string_length = 0;
            lVar16 = 0;
            do {
              uVar8 = *(uint *)(local_438 + lVar16 * 4);
              uVar10 = *(uint *)(local_3c0 + lVar16 * 4);
              iVar24 = uVar8 - uVar10;
              if (uVar8 < uVar10) {
                iVar24 = -(uVar8 - uVar10);
              }
              *(int *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) = iVar24;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            local_3f8._M_dataplus._M_p = (pointer)local_220;
            local_3f8._M_string_length._0_4_ = TStack_218.order;
            local_3f8._M_string_length._4_4_ = TStack_218.type;
            local_3fc[0] = 0;
            local_3fc[1] = 0;
            local_3fc[2] = 0;
            local_3fc[3] = 0;
            lVar16 = 0;
            do {
              local_3fc[lVar16] =
                   *(uint *)((long)&local_3f8._M_dataplus._M_p + lVar16 * 4) <
                   *(uint *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            local_40c[0] = 0;
            local_40c[1] = 0;
            local_40c[2] = 0;
            local_40c[3] = 0;
            lVar16 = 0;
            do {
              local_40c[lVar16] = local_3fc[lVar16] & local_210.m_data[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            if (local_40c[0] == 0) {
              uVar17 = 0xffffffffffffffff;
              do {
                if (uVar17 == 2) {
                  uVar19 = 3;
                  break;
                }
                uVar19 = uVar17 + 1;
                lVar16 = uVar17 + 2;
                uVar17 = uVar19;
              } while (local_40c[lVar16] != 1);
              if (uVar19 < 3) goto LAB_005ffd62;
            }
            else {
LAB_005ffd62:
              bVar14 = tcu::isGatherOffsetsResultValid
                                 (local_340,&local_208,(IntLookupPrecision *)local_238,
                                  (Vec2 *)local_360,(int)local_400,(IVec2 (*) [4])local_1c8,
                                  (UVec4 *)local_3c0);
              if (!bVar14) {
                *(undefined4 *)
                 ((long)local_378.m_pixels.m_ptr + (long)(local_378.m_width * iVar23 + iVar27) * 4)
                     = 0xff0000ff;
                bVar15 = false;
              }
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 != iVar9);
          iVar23 = iVar23 + 1;
          TVar26 = local_408;
        } while (iVar23 != iVar9);
      }
      local_3b0._M_allocated_capacity._0_4_ = 0x69726556;
      local_3b0._M_allocated_capacity._4_4_ = 0x65527966;
      local_3b0._8_4_ = 0x746c7573;
      local_3b8.order = sR;
      local_3b8.type = SNORM_INT8;
      local_3b0._M_local_buf[0xc] = '\0';
      local_438 = (undefined1  [8])&local_428;
      local_1c8._0_4_ = S;
      local_1c8._4_4_ = SNORM_INT8;
      local_3c0 = (undefined1  [8])&local_3b0;
      local_438 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
      local_428._M_allocated_capacity = (size_type)local_1c8;
      *(undefined8 *)local_438 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
      TStack_430.order = local_1c8._0_4_;
      TStack_430.type = local_1c8._4_4_;
      *(char *)((long)local_438 + (long)local_1c8) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&local_338,(string *)local_3c0,(string *)local_438);
      tcu::TestLog::startImageSet
                ((TestLog *)TVar26,local_338.m_name._M_dataplus._M_p,
                 local_338.m_description._M_dataplus._M_p);
      paVar1 = &local_3f8.field_2;
      local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_3f8._M_string_length._0_4_ = RGBA;
      local_3f8._M_string_length._4_4_ = SNORM_INT8;
      local_3f8.field_2._M_local_buf[8] = '\0';
      local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_388._M_allocated_capacity._6_2_ = 0x6465;
      local_388._8_2_ = 0x6920;
      local_388._10_4_ = 0x6567616d;
      local_390 = (void *)0xe;
      local_388._M_local_buf[0xe] = '\0';
      pCVar20 = local_3c8;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      local_398 = (undefined1  [8])&local_388;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3c8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,TVar26.order,__buf_05,(size_t)pCVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,
                        CONCAT26(local_388._M_allocated_capacity._6_2_,
                                 local_388._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      paVar4 = &local_338.m_description.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_description._M_dataplus._M_p != paVar4) {
        operator_delete(local_338.m_description._M_dataplus._M_p,
                        local_338.m_description.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_338.m_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != paVar5) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,(ulong)(local_3b0._M_allocated_capacity + 1));
      }
      if (bVar15 == false) {
        local_438 = (undefined1  [8])&local_428;
        local_428._M_allocated_capacity._0_4_ = 0x65666552;
        local_428._M_allocated_capacity._4_4_ = 0x636e6572;
        local_428._8_2_ = 0x65;
        TStack_430.order = ARGB;
        TStack_430.type = SNORM_INT8;
        local_338.m_name._M_dataplus._M_p = (pointer)0x15;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        local_3f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_338);
        local_3f8.field_2._M_allocated_capacity._0_6_ = SUB86(local_338.m_name._M_dataplus._M_p,0);
        local_3f8.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_338.m_name._M_dataplus._M_p >> 0x30);
        *(undefined8 *)local_3f8._M_dataplus._M_p = 0x6572206c61656449;
        builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 8),"ference ",8);
        builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 0xd),"ce image",8);
        local_3f8._M_string_length = (size_type)local_338.m_name._M_dataplus._M_p;
        *(char *)((long)local_3f8._M_dataplus._M_p + (long)local_338.m_name._M_dataplus._M_p) = '\0'
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_3c0,&local_278);
        pCVar20 = (ConstPixelBufferAccess *)local_3c0;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar20,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_06,(size_t)pCVar20);
        local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_388._M_allocated_capacity._6_2_ = 0x7361;
        local_388._8_2_ = 0x6b;
        local_390 = (void *)0x9;
        local_350._M_allocated_capacity = 0x616d20726f727245;
        local_350._8_2_ = 0x6b73;
        local_358 = (void *)0xa;
        local_350._M_local_buf[10] = '\0';
        pSVar21 = &local_378;
        local_398 = (undefined1  [8])&local_388;
        local_360 = (undefined1  [8])&local_350;
        tcu::LogImage::LogImage
                  (&local_338,(string *)local_398,(string *)local_360,pSVar21,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_338,local_408.order,__buf_07,(size_t)pSVar21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.m_description._M_dataplus._M_p != paVar4) {
          operator_delete(local_338.m_description._M_dataplus._M_p,
                          local_338.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.m_name._M_dataplus._M_p != paVar5) {
          operator_delete(local_338.m_name._M_dataplus._M_p,
                          local_338.m_name.field_2._M_allocated_capacity + 1);
        }
        if (local_360 != (undefined1  [8])&local_350) {
          operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
        }
        if (local_398 != (undefined1  [8])&local_388) {
          operator_delete((void *)local_398,
                          CONCAT26(local_388._M_allocated_capacity._6_2_,
                                   local_388._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          (ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                   local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_408);
    }
    else {
      local_238._0_4_ = CVar25;
      local_238._4_4_ = CVar25;
      local_238._8_4_ = iVar27;
      local_238._12_4_ = iVar23;
      local_238._16_4_ = iVar23;
      local_238._20_4_ = iVar24;
      if (2 < uVar8 - 0x1b) goto LAB_00601429;
      iVar9 = (local_3c8->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_278,&local_3c8->m_format,iVar9,iVar9,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a0,&local_278);
      tcu::Surface::Surface(&local_378,iVar9,iVar9);
      local_338.m_name._M_dataplus._M_p = (pointer)0x300000008;
      if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
        local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_338,local_378.m_width,
                 local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
      local_3c0._0_4_ = 0xff00ff00;
      tcu::RGBA::toVec((RGBA *)&local_338);
      tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)&local_338);
      if (iVar9 < 1) {
        bVar15 = true;
      }
      else {
        local_3d0 = (float)iVar9;
        bVar15 = true;
        iVar23 = 0;
        do {
          local_3cc = (float)iVar23;
          iVar27 = 0;
          do {
            local_1b8._M_allocated_capacity = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = 0;
            local_1c8._0_4_ = R;
            local_1c8._4_4_ = SNORM_INT8;
            TStack_1c0.order = R;
            TStack_1c0.type = SNORM_INT8;
            local_338.m_name._M_dataplus._M_p._4_4_ = iVar23;
            local_338.m_name._M_dataplus._M_p._0_4_ = iVar27;
            (**pPVar13->_vptr_PixelOffsets)(pPVar13,&local_338,(IVec2 (*) [4])local_1c8);
            local_3c0._4_4_ = local_3cc;
            local_3c0._0_4_ = (float)iVar27;
            local_338.m_name._M_dataplus._M_p = (pointer)0x0;
            lVar16 = 0;
            do {
              *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) =
                   *(float *)(local_3c0 + lVar16 * 4) + 0.5;
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            local_438._4_4_ = local_3d0;
            local_438._0_4_ = local_3d0;
            local_398 = (undefined1  [8])0x0;
            lVar16 = 0;
            do {
              *(float *)(local_398 + lVar16 * 4) =
                   *(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) /
                   *(float *)(local_438 + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            triQuadInterpolate<tcu::Vector<float,2>>
                      ((_anonymous_namespace_ *)local_360,local_250,(float)local_398._0_4_,
                       (float)local_398._4_4_);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)local_3c0,(int)local_3c8,iVar27,iVar23);
            tcu::gatherArray2DOffsets
                      ((tcu *)&local_338,local_340->m_levels,&local_208,(float)local_360._0_4_,
                       (float)local_360._4_4_,0,(int)local_400,(IVec2 (*) [4])local_1c8);
            local_438._0_4_ = 0.0;
            local_438._4_4_ = 0.0;
            TStack_430.order = R;
            TStack_430.type = SNORM_INT8;
            lVar16 = 0;
            do {
              *(int *)(local_438 + lVar16 * 4) =
                   (int)*(float *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2a0,(IVec4 *)local_438,iVar27,iVar23,0);
            local_338.m_name._M_dataplus._M_p = (pointer)0x0;
            local_338.m_name._M_string_length = 0;
            lVar16 = 0;
            do {
              iVar24 = *(int *)(local_3c0 + lVar16 * 4);
              iVar11 = *(int *)(local_438 + lVar16 * 4);
              iVar18 = iVar24 - iVar11;
              if (iVar24 - iVar11 == 0 || iVar24 < iVar11) {
                iVar18 = -(iVar24 - iVar11);
              }
              *(int *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4) = iVar18;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            local_3f8._M_dataplus._M_p = (pointer)local_220;
            local_3f8._M_string_length._0_4_ = TStack_218.order;
            local_3f8._M_string_length._4_4_ = TStack_218.type;
            local_3fc[0] = 0;
            local_3fc[1] = 0;
            local_3fc[2] = 0;
            local_3fc[3] = 0;
            lVar16 = 0;
            do {
              local_3fc[lVar16] =
                   *(int *)((long)&local_3f8._M_dataplus._M_p + lVar16 * 4) <
                   *(int *)((long)(&local_338.m_access.m_size + -6) + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            local_40c[0] = 0;
            local_40c[1] = 0;
            local_40c[2] = 0;
            local_40c[3] = 0;
            lVar16 = 0;
            do {
              local_40c[lVar16] = local_3fc[lVar16] & local_210.m_data[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            if (local_40c[0] == 0) {
              uVar17 = 0xffffffffffffffff;
              do {
                if (uVar17 == 2) {
                  uVar19 = 3;
                  break;
                }
                uVar19 = uVar17 + 1;
                lVar16 = uVar17 + 2;
                uVar17 = uVar19;
              } while (local_40c[lVar16] != 1);
              if (uVar19 < 3) goto LAB_006013a6;
            }
            else {
LAB_006013a6:
              bVar14 = tcu::isGatherOffsetsResultValid
                                 (local_340,&local_208,(IntLookupPrecision *)local_238,
                                  (Vec2 *)local_360,(int)local_400,(IVec2 (*) [4])local_1c8,
                                  (IVec4 *)local_3c0);
              if (!bVar14) {
                *(undefined4 *)
                 ((long)local_378.m_pixels.m_ptr + (long)(local_378.m_width * iVar23 + iVar27) * 4)
                     = 0xff0000ff;
                bVar15 = false;
              }
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 != iVar9);
          iVar23 = iVar23 + 1;
          TVar26 = local_408;
        } while (iVar23 != iVar9);
      }
      local_3b0._M_allocated_capacity._0_4_ = 0x69726556;
      local_3b0._M_allocated_capacity._4_4_ = 0x65527966;
      local_3b0._8_4_ = 0x746c7573;
      local_3b8.order = sR;
      local_3b8.type = SNORM_INT8;
      local_3b0._M_local_buf[0xc] = '\0';
      local_438 = (undefined1  [8])&local_428;
      local_1c8._0_4_ = S;
      local_1c8._4_4_ = SNORM_INT8;
      local_3c0 = (undefined1  [8])&local_3b0;
      local_438 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
      local_428._M_allocated_capacity = (size_type)local_1c8;
      *(undefined8 *)local_438 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
      TStack_430.order = local_1c8._0_4_;
      TStack_430.type = local_1c8._4_4_;
      *(char *)((long)local_438 + (long)local_1c8) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&local_338,(string *)local_3c0,(string *)local_438);
      tcu::TestLog::startImageSet
                ((TestLog *)TVar26,local_338.m_name._M_dataplus._M_p,
                 local_338.m_description._M_dataplus._M_p);
      paVar1 = &local_3f8.field_2;
      local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_3f8._M_string_length._0_4_ = RGBA;
      local_3f8._M_string_length._4_4_ = SNORM_INT8;
      local_3f8.field_2._M_local_buf[8] = '\0';
      local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_388._M_allocated_capacity._6_2_ = 0x6465;
      local_388._8_2_ = 0x6920;
      local_388._10_4_ = 0x6567616d;
      local_390 = (void *)0xe;
      local_388._M_local_buf[0xe] = '\0';
      pCVar20 = local_3c8;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      local_398 = (undefined1  [8])&local_388;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3c8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,TVar26.order,__buf_08,(size_t)pCVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,
                        CONCAT26(local_388._M_allocated_capacity._6_2_,
                                 local_388._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      paVar4 = &local_338.m_description.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_description._M_dataplus._M_p != paVar4) {
        operator_delete(local_338.m_description._M_dataplus._M_p,
                        local_338.m_description.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_338.m_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != paVar5) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,(ulong)(local_3b0._M_allocated_capacity + 1));
      }
      if (bVar15 == false) {
        local_438 = (undefined1  [8])&local_428;
        local_428._M_allocated_capacity._0_4_ = 0x65666552;
        local_428._M_allocated_capacity._4_4_ = 0x636e6572;
        local_428._8_2_ = 0x65;
        TStack_430.order = ARGB;
        TStack_430.type = SNORM_INT8;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Ideal reference image","");
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_3c0,&local_278);
        pCVar20 = (ConstPixelBufferAccess *)local_3c0;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar20,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_09,(size_t)pCVar20);
        local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_388._M_allocated_capacity._6_2_ = 0x7361;
        local_388._8_2_ = 0x6b;
        local_390 = (void *)0x9;
        local_350._M_allocated_capacity = 0x616d20726f727245;
        local_350._8_2_ = 0x6b73;
        local_358 = (void *)0xa;
        local_350._M_local_buf[10] = '\0';
        pSVar21 = &local_378;
        local_398 = (undefined1  [8])&local_388;
        local_360 = (undefined1  [8])&local_350;
        tcu::LogImage::LogImage
                  (&local_338,(string *)local_398,(string *)local_360,pSVar21,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_338,local_408.order,__buf_10,(size_t)pSVar21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.m_description._M_dataplus._M_p != paVar4) {
          operator_delete(local_338.m_description._M_dataplus._M_p,
                          local_338.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.m_name._M_dataplus._M_p != paVar5) {
          operator_delete(local_338.m_name._M_dataplus._M_p,
                          local_338.m_name.field_2._M_allocated_capacity + 1);
        }
        if (local_360 != (undefined1  [8])&local_350) {
          operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
        }
        if (local_398 != (undefined1  [8])&local_388) {
          operator_delete((void *)local_398,
                          CONCAT26(local_388._M_allocated_capacity._6_2_,
                                   local_388._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          (ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                   local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_408);
    }
  }
  tcu::Surface::~Surface(&local_378);
  tcu::TextureLevel::~TextureLevel(&local_278);
LAB_00601011:
  if (local_248.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_248.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
  return bVar15;
}

Assistant:

bool TextureGatherCase::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_testCtx.getLog();

	if (m_flags & GATHERCASE_MIPMAP_INCOMPLETE)
	{
		const int	componentNdx		= de::max(0, gatherArgs.componentNdx);
		const Vec4	incompleteColor		(0.0f, 0.0f, 0.0f, 1.0f);
		const Vec4	refColor			(incompleteColor[componentNdx]);
		const bool	isOk				= verifySingleColored(log, rendered, refColor);

		if (!isOk)
			log << TestLog::Message << "Note: expected color " << refColor << " for all pixels; "
									<< incompleteColor[componentNdx] << " is component at index " << componentNdx
									<< " in the color " << incompleteColor << ", which is used for incomplete textures" << TestLog::EndMessage;

		return isOk;
	}
	else
	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_gatherType, gatherArgs, getOffsetRange());
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_wrapS;
		sampler.wrapT		= m_wrapT;
		sampler.compare		= m_shadowCompareMode;

		if (isDepthFormat(m_textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_textureFormat.type) || isSIntFormatType(m_textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}